

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

bool __thiscall
QCommandLineParserPrivate::parseOptionValue
          (QCommandLineParserPrivate *this,QString *optionName,QString *argument,
          const_iterator *argumentIterator,const_iterator argsEnd)

{
  bool bVar1;
  byte bVar2;
  qsizetype qVar3;
  longlong *plVar4;
  const_iterator *in_RCX;
  QString *in_RDX;
  QString *in_R8;
  long in_FS_OFFSET;
  bool withValue;
  QCommandLineOption *option;
  qsizetype assignPos;
  mapped_type optionOffset;
  const_iterator nameHashIt;
  QLatin1Char assignChar;
  undefined4 in_stack_fffffffffffffe78;
  CaseSensitivity in_stack_fffffffffffffe7c;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  QString *in_stack_fffffffffffffe88;
  QHash<long_long,_QList<QString>_> *in_stack_fffffffffffffe90;
  int iVar5;
  QString *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  QString *this_00;
  QChar QVar6;
  bool local_10b;
  QChar local_10a [52];
  QChar local_a2 [25];
  QString *local_70;
  QFlagsStorageHelper<QCommandLineOption::Flag,_4> local_50;
  QFlagsStorageHelper<QCommandLineOption::Flag,_4> local_4c;
  longlong local_48;
  char local_3b;
  piter local_38;
  piter local_28;
  QLatin1Char local_11;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_11.ch = -0x56;
  local_10.i = in_R8;
  QLatin1Char::QLatin1Char(&local_11,'=');
  local_28.bucket = 0xaaaaaaaaaaaaaaaa;
  local_28.d = (Data<QHashPrivate::Node<QString,_long_long>_> *)0xaaaaaaaaaaaaaaaa;
  local_28 = (piter)QHash<QString,_long_long>::constFind
                              ((QHash<QString,_long_long> *)
                               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_38 = (piter)QHash<QString,_long_long>::constEnd
                              ((QHash<QString,_long_long> *)in_stack_fffffffffffffe88);
  bVar1 = QHash<QString,_long_long>::const_iterator::operator!=
                    ((const_iterator *)in_stack_fffffffffffffe88,
                     (const_iterator *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80)
                    );
  if (bVar1) {
    local_3b = local_11.ch;
    this_00 = in_RDX;
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffffe88 >> 0x38));
    qVar3 = QString::indexOf(in_stack_fffffffffffffe88,(QChar)(char16_t)((ulong)this_00 >> 0x30),
                             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                             in_stack_fffffffffffffe7c);
    plVar4 = QHash<QString,_long_long>::const_iterator::operator*((const_iterator *)0x177778);
    local_48 = *plVar4;
    QList<QCommandLineOption>::at
              ((QList<QCommandLineOption> *)
               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    local_50.super_QFlagsStorage<QCommandLineOption::Flag>.i =
         (QFlagsStorage<QCommandLineOption::Flag>)
         QCommandLineOption::flags
                   ((QCommandLineOption *)
                    CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    local_4c.super_QFlagsStorage<QCommandLineOption::Flag>.i =
         (QFlagsStorage<QCommandLineOption::Flag>)
         QFlags<QCommandLineOption::Flag>::operator&
                   ((QFlags<QCommandLineOption::Flag> *)
                    CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                    in_stack_fffffffffffffe7c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_4c);
    if (bVar1) {
      in_RCX->i = local_10.i;
      local_10b = true;
      goto LAB_00177a72;
    }
    QCommandLineOption::valueName((QCommandLineOption *)in_stack_fffffffffffffe88);
    bVar1 = QString::isEmpty((QString *)0x177823);
    bVar2 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x177836);
    if ((bVar2 & 1) == 0) {
      if (qVar3 != -1) {
        QCommandLineParser::tr
                  ((char *)in_stack_fffffffffffffe88,
                   (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe7c);
        QVar6.ucs = (char16_t)((ulong)qVar3 >> 0x30);
        QString::left(in_stack_fffffffffffffe98,(qsizetype)in_stack_fffffffffffffe90);
        iVar5 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        QChar::QChar<char16_t,_true>(local_10a,L' ');
        QString::arg<QString,_true>
                  ((QString *)CONCAT17(bVar2,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                   iVar5,QVar6);
        QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
        QString::~QString((QString *)0x177a48);
        QString::~QString((QString *)0x177a55);
        QString::~QString((QString *)0x177a62);
        local_10b = false;
        goto LAB_00177a72;
      }
    }
    else if (qVar3 == -1) {
      QList<QString>::const_iterator::operator++(in_RCX);
      QVar6.ucs = (char16_t)((ulong)qVar3 >> 0x30);
      local_70 = local_10.i;
      bVar1 = QList<QString>::const_iterator::operator==(in_RCX,local_10);
      if (bVar1) {
        QCommandLineParser::tr
                  ((char *)in_stack_fffffffffffffe88,
                   (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe7c);
        iVar5 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        QChar::QChar<char16_t,_true>(local_a2,L' ');
        QString::arg<QString,_true>
                  ((QString *)CONCAT17(bVar2,in_stack_fffffffffffffea0),in_RDX,iVar5,QVar6);
        QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
        QString::~QString((QString *)0x177909);
        QString::~QString((QString *)0x177916);
        local_10b = false;
        goto LAB_00177a72;
      }
      QHash<long_long,_QList<QString>_>::operator[]
                (in_stack_fffffffffffffe90,(longlong *)in_stack_fffffffffffffe88);
      QList<QString>::const_iterator::operator*(in_RCX);
      QList<QString>::append
                ((QList<QString> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (parameter_type)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    else {
      QHash<long_long,_QList<QString>_>::operator[]
                (in_stack_fffffffffffffe90,(longlong *)in_stack_fffffffffffffe88);
      QString::mid(this_00,CONCAT17(bVar2,in_stack_fffffffffffffea0),
                   (qsizetype)in_stack_fffffffffffffe98);
      QList<QString>::append
                ((QList<QString> *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QString::~QString((QString *)0x1779b0);
    }
  }
  local_10b = true;
LAB_00177a72:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10b;
}

Assistant:

bool QCommandLineParserPrivate::parseOptionValue(const QString &optionName, const QString &argument,
                                                 QStringList::const_iterator *argumentIterator, QStringList::const_iterator argsEnd)
{
    const QLatin1Char assignChar('=');
    const NameHash_t::const_iterator nameHashIt = nameHash.constFind(optionName);
    if (nameHashIt != nameHash.constEnd()) {
        const qsizetype assignPos = argument.indexOf(assignChar);
        const NameHash_t::mapped_type optionOffset = *nameHashIt;
        const QCommandLineOption &option = commandLineOptionList.at(optionOffset);
        if (option.flags() & QCommandLineOption::IgnoreOptionsAfter) {
            *argumentIterator = argsEnd;
            return true;
        }
        const bool withValue = !option.valueName().isEmpty();
        if (withValue) {
            if (assignPos == -1) {
                ++(*argumentIterator);
                if (*argumentIterator == argsEnd) {
                    errorText = QCommandLineParser::tr("Missing value after '%1'.").arg(argument);
                    return false;
                }
                optionValuesHash[optionOffset].append(*(*argumentIterator));
            } else {
                optionValuesHash[optionOffset].append(argument.mid(assignPos + 1));
            }
        } else {
            if (assignPos != -1) {
                errorText = QCommandLineParser::tr("Unexpected value after '%1'.").arg(argument.left(assignPos));
                return false;
            }
        }
    }
    return true;
}